

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_> * __thiscall
kj::Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_>::operator=
          (Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_> *this,
          Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_> *other)

{
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }